

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::listsinceblock(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffdea8;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *paVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffdeb0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffdeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffded8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdee0;
  UniValue *in_stack_ffffffffffffdee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdef0;
  undefined7 in_stack_ffffffffffffdef8;
  undefined1 in_stack_ffffffffffffdeff;
  string *in_stack_ffffffffffffdf00;
  undefined7 in_stack_ffffffffffffdf08;
  undefined1 in_stack_ffffffffffffdf0f;
  undefined4 in_stack_ffffffffffffdf10;
  Type in_stack_ffffffffffffdf14;
  string *in_stack_ffffffffffffdf18;
  undefined4 in_stack_ffffffffffffdf20;
  Type in_stack_ffffffffffffdf24;
  undefined4 in_stack_ffffffffffffdf28;
  Type in_stack_ffffffffffffdf2c;
  RPCResult *in_stack_ffffffffffffdf30;
  undefined1 *local_2048;
  undefined1 *local_2030;
  undefined1 *local_2018;
  RPCExamples *in_stack_ffffffffffffdff0;
  RPCResults *in_stack_ffffffffffffdff8;
  undefined1 *puVar4;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *in_stack_ffffffffffffe008;
  string *in_stack_ffffffffffffe010;
  RPCHelpMan *in_stack_ffffffffffffe018;
  undefined1 *local_1fd0;
  RPCMethodImpl *fun;
  undefined1 local_1c80 [34];
  allocator<char> local_1c5e;
  allocator<char> local_1c5d;
  allocator<char> local_1c5c;
  allocator<char> local_1c5b;
  allocator<char> local_1c5a [2];
  pointer local_1c58;
  pointer pRStack_1c50;
  pointer local_1c48;
  allocator<char> local_1c3b;
  allocator<char> local_1c3a [32];
  allocator<char> local_1c1a;
  allocator<char> local_1c19 [29];
  allocator<char> local_1bfc;
  allocator<char> local_1bfb [19];
  undefined8 local_1be8;
  allocator<char> local_1bda;
  allocator<char> local_1bd9;
  size_type local_1bd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1bd0;
  allocator<char> local_1bb2;
  RPCMethodImpl local_1bb1;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  allocator<char> local_1b59;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  allocator<char> local_1b3a;
  allocator<char> local_1b39;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  allocator<char> local_1b19;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  allocator<char> local_1afa;
  allocator<char> local_1af9;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  allocator<char> local_1ada;
  allocator<char> local_1ad9;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  allocator<char> local_1ab2;
  allocator<char> local_1ab1 [79];
  allocator<char> local_1a62;
  allocator<char> local_1a61 [31];
  allocator<char> local_1a42;
  allocator<char> local_1a41 [31];
  allocator<char> local_1a22;
  allocator<char> local_1a21 [32];
  allocator<char> local_1a01;
  undefined4 local_1a00;
  allocator<char> local_19fb;
  allocator<char> local_19fa;
  undefined1 local_19f9;
  allocator<char> local_19f8;
  allocator<char> local_19f7;
  undefined1 local_19f6;
  allocator<char> local_19f5;
  allocator<char> local_19f4;
  allocator<char> local_19f3;
  allocator<char> local_19f2;
  allocator<char> local_19f1;
  undefined4 local_19f0;
  allocator<char> local_19ea;
  allocator<char> local_19e9;
  undefined4 local_19e8;
  allocator<char> local_19e1 [31];
  allocator<char> local_19c2;
  allocator<char> local_19c1 [513];
  undefined1 local_17c0 [136];
  undefined1 local_1738 [192];
  undefined1 local_1678 [272];
  undefined1 local_1568 [448];
  undefined1 local_13a8 [816];
  undefined1 local_1078 [64];
  undefined1 local_1038 [56];
  undefined8 local_1000;
  undefined1 local_fb0 [64];
  undefined1 local_f70 [408];
  undefined1 local_dd8 [200];
  undefined1 local_d10;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined1 local_cd0;
  undefined1 local_ccf;
  undefined1 local_c28;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined1 local_be8;
  undefined1 local_be7;
  undefined1 local_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined1 local_aa8;
  undefined1 local_aa7;
  undefined1 local_9a8;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined1 local_968;
  undefined1 local_967;
  undefined1 local_8a0;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined1 local_860;
  undefined1 local_85f;
  undefined1 local_760;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined1 local_720;
  undefined1 local_71f;
  undefined1 local_678 [1584];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_19e8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_760 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdec0);
  local_738 = 0;
  uStack_730 = 0;
  local_728 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdea8);
  local_720 = 0;
  local_71f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
                 in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
                 in_stack_ffffffffffffdf00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_19f0 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffdee8,(int *)in_stack_ffffffffffffdee0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_8a0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdec0);
  local_878 = 0;
  uStack_870 = 0;
  local_868 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdea8);
  local_860 = 0;
  local_85f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
                 in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
                 in_stack_ffffffffffffdf00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdeb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_9a8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdec0);
  local_980 = 0;
  uStack_978 = 0;
  local_970 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdea8);
  local_968 = 0;
  local_967 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
                 in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
                 in_stack_ffffffffffffdf00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_19f6 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdee8,(bool *)in_stack_ffffffffffffdee0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_ae8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdec0);
  local_ac0 = 0;
  uStack_ab8 = 0;
  local_ab0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdea8);
  local_aa8 = 0;
  local_aa7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
                 in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
                 in_stack_ffffffffffffdf00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_19f9 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdee8,(bool *)in_stack_ffffffffffffdee0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_c28 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdec0);
  local_c00 = 0;
  uStack_bf8 = 0;
  local_bf0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdea8);
  local_be8 = 0;
  local_be7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
                 in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
                 in_stack_ffffffffffffdf00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1a00 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_d10 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdec0);
  local_ce8 = 0;
  uStack_ce0 = 0;
  local_cd8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdea8);
  local_cd0 = 0;
  local_ccf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
                 in_stack_ffffffffffffdf18,in_stack_ffffffffffffdf14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
                 in_stack_ffffffffffffdf00,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffdea8);
  __l._M_len._0_7_ = in_stack_ffffffffffffdef8;
  __l._M_array = (iterator)in_stack_ffffffffffffdef0;
  __l._M_len._7_1_ = in_stack_ffffffffffffdeff;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdee8,__l,
             (allocator_type *)in_stack_ffffffffffffdee0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1ad8 = 0;
  uStack_1ad0 = 0;
  local_1ac8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdea8);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffdea8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf18,
             SUB41(in_stack_ffffffffffffdf14 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf00,
             (bool)in_stack_ffffffffffffdeff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1af8 = 0;
  uStack_1af0 = 0;
  local_1ae8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf18,
             SUB41(in_stack_ffffffffffffdf14 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf00,
             (bool)in_stack_ffffffffffffdeff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1b18 = 0;
  uStack_1b10 = 0;
  local_1b08 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
                 in_stack_ffffffffffffdef0);
  std::operator+(in_stack_ffffffffffffdec0,(char *)in_stack_ffffffffffffdeb8);
  local_1b38 = 0;
  uStack_1b30 = 0;
  local_1b28 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1b58 = 0;
  uStack_1b50 = 0;
  local_1b48 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
                 in_stack_ffffffffffffdef0);
  std::operator+(in_stack_ffffffffffffdec0,(char *)in_stack_ffffffffffffdeb8);
  local_1b78 = 0;
  uStack_1b70 = 0;
  local_1b68 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf18,
             SUB41(in_stack_ffffffffffffdf14 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf00,
             (bool)in_stack_ffffffffffffdeff);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffdef8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffdef0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffdeff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee8,__l_00,
             (allocator_type *)in_stack_ffffffffffffdee0);
  TransactionDescriptionString();
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee0,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffded8);
  fun = &local_1bb1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1bd8 = 0;
  aStack_1bd0._M_allocated_capacity = 0;
  aStack_1bd0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1bfb[3] = (allocator<char>)0x0;
  local_1bfb[4] = (allocator<char>)0x0;
  local_1bfb[5] = (allocator<char>)0x0;
  local_1bfb[6] = (allocator<char>)0x0;
  local_1bfb[7] = (allocator<char>)0x0;
  local_1bfb[8] = (allocator<char>)0x0;
  local_1bfb[9] = (allocator<char>)0x0;
  local_1bfb[10] = (allocator<char>)0x0;
  local_1bfb[0xb] = (allocator<char>)0x0;
  local_1bfb[0xc] = (allocator<char>)0x0;
  local_1bfb[0xd] = (allocator<char>)0x0;
  local_1bfb[0xe] = (allocator<char>)0x0;
  local_1bfb[0xf] = (allocator<char>)0x0;
  local_1bfb[0x10] = (allocator<char>)0x0;
  local_1bfb[0x11] = (allocator<char>)0x0;
  local_1bfb[0x12] = (allocator<char>)0x0;
  local_1be8._0_1_ = '\0';
  local_1be8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf18,
             SUB41(in_stack_ffffffffffffdf14 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf00,
             (bool)in_stack_ffffffffffffdeff);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffdef8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffdef0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffdeff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee8,__l_01,
             (allocator_type *)in_stack_ffffffffffffdee0);
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee0,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffded8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffdef8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffdef0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffdeff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee8,__l_02,
             (allocator_type *)in_stack_ffffffffffffdee0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1c3a[2] = (allocator<char>)0x0;
  local_1c3a[3] = (allocator<char>)0x0;
  local_1c3a[4] = (allocator<char>)0x0;
  local_1c3a[5] = (allocator<char>)0x0;
  local_1c3a[6] = (allocator<char>)0x0;
  local_1c3a[7] = (allocator<char>)0x0;
  local_1c3a[8] = (allocator<char>)0x0;
  local_1c3a[9] = (allocator<char>)0x0;
  local_1c3a[10] = (allocator<char>)0x0;
  local_1c3a[0xb] = (allocator<char>)0x0;
  local_1c3a[0xc] = (allocator<char>)0x0;
  local_1c3a[0xd] = (allocator<char>)0x0;
  local_1c3a[0xe] = (allocator<char>)0x0;
  local_1c3a[0xf] = (allocator<char>)0x0;
  local_1c3a[0x10] = (allocator<char>)0x0;
  local_1c3a[0x11] = (allocator<char>)0x0;
  local_1c3a[0x12] = (allocator<char>)0x0;
  local_1c3a[0x13] = (allocator<char>)0x0;
  local_1c3a[0x14] = (allocator<char>)0x0;
  local_1c3a[0x15] = (allocator<char>)0x0;
  local_1c3a[0x16] = (allocator<char>)0x0;
  local_1c3a[0x17] = (allocator<char>)0x0;
  local_1c3a[0x18] = (allocator<char>)0x0;
  local_1c3a[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffdef8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffdef0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffdeff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee8,__l_03,
             (allocator_type *)in_stack_ffffffffffffdee0);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf18,
             SUB41(in_stack_ffffffffffffdf14 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdf0f,in_stack_ffffffffffffdf08),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf00,
             (bool)in_stack_ffffffffffffdeff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  local_1c58 = (pointer)0x0;
  pRStack_1c50 = (pointer)0x0;
  local_1c48 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffdef8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffdef0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffdeff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdee8,__l_04,
             (allocator_type *)in_stack_ffffffffffffdee0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf2c,
             (string *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20),
             in_stack_ffffffffffffdf18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
             (bool)in_stack_ffffffffffffdf0f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffdf2c,in_stack_ffffffffffffdf28),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffdf24,in_stack_ffffffffffffdf20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  HelpExampleCli(in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  HelpExampleCli(in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  std::operator+(in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeff,in_stack_ffffffffffffdef8),
             (char *)in_stack_ffffffffffffdef0,(allocator<char> *)in_stack_ffffffffffffdee8);
  HelpExampleRpc(in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  std::operator+(in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0x5bdf50);
  this = (RPCArg *)local_1c80;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listsinceblock()::__0,void>
            (in_stack_ffffffffffffdeb8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffdeb0);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe018,in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,args,
             in_stack_ffffffffffffdff8,in_stack_ffffffffffffdff0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c80 + 0x21));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c5e);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c5d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c5c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c5b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c5a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1fd0 = local_dd8;
  do {
    local_1fd0 = local_1fd0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1fd0 != local_f70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c3b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c3a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_17c0;
  puVar1 = local_1738;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c19);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bfc);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1bfb);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_1038;
  puVar1 = local_fb0;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2018 = local_1568;
  do {
    local_2018 = local_2018 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2018 != local_1678);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bd9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bb2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2030 = local_1078;
  do {
    local_2030 = local_2030 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2030 != local_13a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1afa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1af9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ada);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ad9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdeb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ab2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1ab1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a62);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a61);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a42);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a41);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a22);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1a21);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdeb8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_2048 = local_48;
  do {
    local_2048 = local_2048 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_2048 != local_678);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a01);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19fb);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19fa);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f7);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f5);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f4);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f3);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19ea);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19e9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_19e1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19c2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_19c1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listsinceblock()
{
    return RPCHelpMan{"listsinceblock",
                "\nGet all transactions in blocks since block [blockhash], or all transactions if omitted.\n"
                "If \"blockhash\" is no longer a part of the main chain, transactions from the fork point onward are included.\n"
                "Additionally, if include_removed is set, transactions affecting the wallet which were removed are returned in the \"removed\" array.\n",
                {
                    {"blockhash", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If set, the block hash to list transactions since, otherwise list all transactions."},
                    {"target_confirmations", RPCArg::Type::NUM, RPCArg::Default{1}, "Return the nth block hash from the main chain. e.g. 1 would mean the best block hash. Note: this is not used as a filter, but only affects [lastblock] in the return value"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Include transactions to watch-only addresses (see 'importaddress')"},
                    {"include_removed", RPCArg::Type::BOOL, RPCArg::Default{true}, "Show transactions that were removed due to a reorg in the \"removed\" array\n"
                                                                       "(not guaranteed to work on pruned nodes)"},
                    {"include_change", RPCArg::Type::BOOL, RPCArg::Default{false}, "Also add entries for change outputs.\n"},
                    {"label", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Return only incoming transactions paying to addresses with the specified label.\n"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "transactions", "",
                        {
                            {RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                            {
                                {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                                {RPCResult::Type::STR, "address",  /*optional=*/true, "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."},
                                {RPCResult::Type::STR, "category", "The transaction category.\n"
                                    "\"send\"                  Transactions sent.\n"
                                    "\"receive\"               Non-coinbase transactions received.\n"
                                    "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                    "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                    "\"orphan\"                Orphaned coinbase transactions received."},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT + ". This is negative for the 'send' category, and is positive\n"
                                    "for all other categories"},
                                {RPCResult::Type::NUM, "vout", "the vout value"},
                                {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                     "'send' category of transactions."},
                            },
                            TransactionDescriptionString()),
                            {
                                {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                            })},
                        }},
                        {RPCResult::Type::ARR, "removed", /*optional=*/true, "<structure is the same as \"transactions\" above, only present if include_removed=true>\n"
                            "Note: transactions that were re-added in the active chain will appear as-is in this array, and may thus have a positive confirmation count."
                        , {{RPCResult::Type::ELISION, "", ""},}},
                        {RPCResult::Type::STR_HEX, "lastblock", "The hash of the block (target_confirmations-1) from the best block on the main chain, or the genesis hash if the referenced block does not exist yet. This is typically used to feed back into listsinceblock the next time you call it. So you would generally use a target_confirmations of say 6, so you will be continually re-notified of transactions until they've reached 6 confirmations plus any new ones"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listsinceblock", "")
            + HelpExampleCli("listsinceblock", "\"000000000000000bacf66f7497b7dc45ef753ee9a7d38571037cdb1a57f663ad\" 6")
            + HelpExampleRpc("listsinceblock", "\"000000000000000bacf66f7497b7dc45ef753ee9a7d38571037cdb1a57f663ad\", 6")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    const CWallet& wallet = *pwallet;
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    LOCK(wallet.cs_wallet);

    std::optional<int> height;    // Height of the specified block or the common ancestor, if the block provided was in a deactivated chain.
    std::optional<int> altheight; // Height of the specified block, even if it's in a deactivated chain.
    int target_confirms = 1;
    isminefilter filter = ISMINE_SPENDABLE;

    uint256 blockId;
    if (!request.params[0].isNull() && !request.params[0].get_str().empty()) {
        blockId = ParseHashV(request.params[0], "blockhash");
        height = int{};
        altheight = int{};
        if (!wallet.chain().findCommonAncestor(blockId, wallet.GetLastBlockHash(), /*ancestor_out=*/FoundBlock().height(*height), /*block1_out=*/FoundBlock().height(*altheight))) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }

    if (!request.params[1].isNull()) {
        target_confirms = request.params[1].getInt<int>();

        if (target_confirms < 1) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter");
        }
    }

    if (ParseIncludeWatchonly(request.params[2], wallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    bool include_removed = (request.params[3].isNull() || request.params[3].get_bool());
    bool include_change = (!request.params[4].isNull() && request.params[4].get_bool());

    // Only set it if 'label' was provided.
    std::optional<std::string> filter_label;
    if (!request.params[5].isNull()) filter_label.emplace(LabelFromValue(request.params[5]));

    int depth = height ? wallet.GetLastBlockHeight() + 1 - *height : -1;

    UniValue transactions(UniValue::VARR);

    for (const std::pair<const uint256, CWalletTx>& pairWtx : wallet.mapWallet) {
        const CWalletTx& tx = pairWtx.second;

        if (depth == -1 || abs(wallet.GetTxDepthInMainChain(tx)) < depth) {
            ListTransactions(wallet, tx, 0, true, transactions, filter, filter_label, include_change);
        }
    }

    // when a reorg'd block is requested, we also list any relevant transactions
    // in the blocks of the chain that was detached
    UniValue removed(UniValue::VARR);
    while (include_removed && altheight && *altheight > *height) {
        CBlock block;
        if (!wallet.chain().findBlock(blockId, FoundBlock().data(block)) || block.IsNull()) {
            throw JSONRPCError(RPC_INTERNAL_ERROR, "Can't read block from disk");
        }
        for (const CTransactionRef& tx : block.vtx) {
            auto it = wallet.mapWallet.find(tx->GetHash());
            if (it != wallet.mapWallet.end()) {
                // We want all transactions regardless of confirmation count to appear here,
                // even negative confirmation ones, hence the big negative.
                ListTransactions(wallet, it->second, -100000000, true, removed, filter, filter_label, include_change);
            }
        }
        blockId = block.hashPrevBlock;
        --*altheight;
    }

    uint256 lastblock;
    target_confirms = std::min(target_confirms, wallet.GetLastBlockHeight() + 1);
    CHECK_NONFATAL(wallet.chain().findAncestorByHeight(wallet.GetLastBlockHash(), wallet.GetLastBlockHeight() + 1 - target_confirms, FoundBlock().hash(lastblock)));

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("transactions", std::move(transactions));
    if (include_removed) ret.pushKV("removed", std::move(removed));
    ret.pushKV("lastblock", lastblock.GetHex());

    return ret;
},
    };
}